

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBody.cpp
# Opt level: O0

void __thiscall
btMultiBody::setupRevolute
          (btMultiBody *this,int i,btScalar mass,btVector3 *inertia,int parent,
          btQuaternion *rotParentToThis,btVector3 *jointAxis,btVector3 *parentComToThisPivotOffset,
          btVector3 *thisPivotToThisComOffset,bool disableParentCollision)

{
  undefined8 uVar1;
  btMultibodyLink *pbVar2;
  int in_ECX;
  btVector3 *in_RDX;
  int in_ESI;
  long in_RDI;
  btMultiBody *this_00;
  undefined8 *in_R8;
  btVector3 *in_R9;
  btScalar in_XMM0_Da;
  btVector3 bVar3;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  byte in_stack_00000018;
  btScalar *in_stack_00000188;
  btMultibodyLink *in_stack_00000190;
  undefined4 in_stack_ffffffffffffff80;
  btVector3 local_44;
  byte local_31;
  btVector3 *local_30;
  undefined8 *local_28;
  int local_1c;
  btVector3 *local_18;
  int local_c;
  
  local_31 = in_stack_00000018 & 1;
  *(int *)(in_RDI + 0x234) = *(int *)(in_RDI + 0x234) + 1;
  *(int *)(in_RDI + 0x238) = *(int *)(in_RDI + 0x238) + 1;
  this_00 = (btMultiBody *)(in_RDI + 0x90);
  local_30 = in_R9;
  local_28 = in_R8;
  local_1c = in_ECX;
  local_18 = in_RDX;
  local_c = in_ESI;
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)this_00,in_ESI);
  pbVar2->m_mass = in_XMM0_Da;
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)this_00,local_c);
  uVar1 = *(undefined8 *)(local_18->m_floats + 2);
  *(undefined8 *)(pbVar2->m_inertiaLocal).m_floats = *(undefined8 *)local_18->m_floats;
  *(undefined8 *)((pbVar2->m_inertiaLocal).m_floats + 2) = uVar1;
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)this_00,local_c);
  pbVar2->m_parent = local_1c;
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)this_00,local_c);
  uVar1 = local_28[1];
  *(undefined8 *)(pbVar2->m_zeroRotParentToThis).super_btQuadWord.m_floats = *local_28;
  *(undefined8 *)((pbVar2->m_zeroRotParentToThis).super_btQuadWord.m_floats + 2) = uVar1;
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)this_00,local_c);
  btMultibodyLink::setAxisTop(pbVar2,0,local_30);
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)this_00,local_c);
  bVar3 = btVector3::cross((btVector3 *)CONCAT44(local_1c,in_stack_ffffffffffffff80),local_18);
  local_44.m_floats._8_8_ = bVar3.m_floats._8_8_;
  local_44.m_floats._0_8_ = bVar3.m_floats._0_8_;
  btMultibodyLink::setAxisBottom(pbVar2,0,&local_44);
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  *(undefined8 *)(pbVar2->m_dVector).m_floats = *in_stack_00000010;
  *(undefined8 *)((pbVar2->m_dVector).m_floats + 2) = in_stack_00000010[1];
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  *(undefined8 *)(pbVar2->m_eVector).m_floats = *in_stack_00000008;
  *(undefined8 *)((pbVar2->m_eVector).m_floats + 2) = in_stack_00000008[1];
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  pbVar2->m_jointType = eRevolute;
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  pbVar2->m_dofCount = 1;
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  pbVar2->m_posVarCount = 1;
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  pbVar2->m_jointPos[0] = 0.0;
  pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                     ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  pbVar2->m_jointTorque[0] = 0.0;
  if ((local_31 & 1) != 0) {
    pbVar2 = btAlignedObjectArray<btMultibodyLink>::operator[]
                       ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
    pbVar2->m_flags = pbVar2->m_flags | 1;
  }
  btAlignedObjectArray<btMultibodyLink>::operator[]
            ((btAlignedObjectArray<btMultibodyLink> *)(in_RDI + 0x90),local_c);
  btMultibodyLink::updateCacheMultiDof(in_stack_00000190,in_stack_00000188);
  updateLinksDofOffsets(this_00);
  return;
}

Assistant:

void btMultiBody::setupRevolute(int i,
                              btScalar mass,
                              const btVector3 &inertia,
                              int parent,
                              const btQuaternion &rotParentToThis,
                              const btVector3 &jointAxis,
                              const btVector3 &parentComToThisPivotOffset,
                              const btVector3 &thisPivotToThisComOffset,
							  bool disableParentCollision)
{
	m_dofCount += 1;
	m_posVarCnt += 1;
	
    m_links[i].m_mass = mass;
    m_links[i].m_inertiaLocal = inertia;
    m_links[i].m_parent = parent;
    m_links[i].m_zeroRotParentToThis = rotParentToThis;
    m_links[i].setAxisTop(0, jointAxis);
    m_links[i].setAxisBottom(0, jointAxis.cross(thisPivotToThisComOffset));
    m_links[i].m_dVector = thisPivotToThisComOffset;
    m_links[i].m_eVector = parentComToThisPivotOffset;

	m_links[i].m_jointType = btMultibodyLink::eRevolute;
	m_links[i].m_dofCount = 1;
	m_links[i].m_posVarCount = 1;	
	m_links[i].m_jointPos[0] = 0.f;
	m_links[i].m_jointTorque[0] = 0.f;

	if (disableParentCollision)
		m_links[i].m_flags |=BT_MULTIBODYLINKFLAGS_DISABLE_PARENT_COLLISION;
    //
	m_links[i].updateCacheMultiDof();
	//
	updateLinksDofOffsets();
}